

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O0

void deqp::egl::finish(EGLint api,ApiFunctions *func)

{
  ApiFunctions *func_local;
  EGLint api_local;
  
  if (api == 1) {
    gles1::finish();
  }
  else if (api == 2) {
    vg::finish();
  }
  else if (api == 4) {
    gles2::finish(&func->gl);
  }
  else if (api == 0x40) {
    gles2::finish(&func->gl);
  }
  return;
}

Assistant:

static void finish (EGLint api, const ApiFunctions& func)
{
	switch (api)
	{
		case EGL_OPENGL_ES_BIT:			gles1::finish();		break;
		case EGL_OPENGL_ES2_BIT:		gles2::finish(func.gl);	break;
		case EGL_OPENGL_ES3_BIT_KHR:	gles2::finish(func.gl);	break;
		case EGL_OPENVG_BIT:			vg::finish();			break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}